

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O2

void __thiscall
clipp::documentation::write<std::__cxx11::ostringstream>
          (documentation *this,
          basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *os)

{
  formatting_ostream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  
  local_30.curCol_ = 0;
  local_30.curParagraphLines_ = 1;
  local_30.totalNonBlankLines_ = 0;
  local_30.firstCol_ = (this->fmt_).firstCol_;
  local_30.firstCol_ = ~(local_30.firstCol_ >> 0x1f) & local_30.firstCol_;
  local_30.lastCol_ = (this->fmt_).lastCol_;
  local_30.lastCol_ = ~(local_30.lastCol_ >> 0x1f) & local_30.lastCol_;
  local_30.hangingIndent_ = 0;
  local_30.paragraphSpacing_ = 0;
  local_30.paragraphSpacingThreshold_ = 2;
  local_30.curBlankLines_ = 0;
  local_30.ignoreInputNls_ = (this->fmt_).ignoreNewlines_;
  local_30.os_ = os;
  print_doc<std::__cxx11::ostringstream>(this,&local_30,this->cli_,0);
  return;
}

Assistant:

void write(OStream& os) const {
        detail::formatting_ostream<OStream> fos(os);
        fos.first_column(fmt_.first_column());
        fos.last_column(fmt_.last_column());
        fos.hanging_indent(0);
        fos.paragraph_spacing(0);
        fos.ignore_newline_chars(fmt_.ignore_newline_chars());
        print_doc(fos, cli_);
     }